

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

int __thiscall FIX::IntField::getValue(IntField *this)

{
  int iVar1;
  string *value;
  FieldConvertError *anon_var_0;
  IntField *this_local;
  
  value = FieldBase::getString_abi_cxx11_(&this->super_FieldBase);
  iVar1 = IntTConvertor<int>::convert(value);
  return iVar1;
}

Assistant:

EXCEPT(IncorrectDataFormat) {
    try {
      return IntConvertor::convert(getString());
    } catch (FieldConvertError &) {
      throw IncorrectDataFormat(getTag(), getString());
    }
  }